

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_bitmap_of_32(void **param_1)

{
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  char *pcVar1;
  Roaring r3a;
  Roaring r1d;
  Roaring r2;
  Roaring r1;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Roaring *this;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 uVar4;
  size_type in_stack_fffffffffffffed8;
  uint local_114;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator puVar7;
  size_type sVar8;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 *local_c0;
  undefined8 local_b8;
  Roaring local_88;
  char local_4c [12];
  char *local_40;
  Roaring local_30;
  
  local_4c[0] = '\x01';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  local_4c[4] = '\x02';
  local_4c[5] = '\0';
  local_4c[6] = '\0';
  local_4c[7] = '\0';
  local_4c[8] = '\x04';
  local_4c[9] = '\0';
  local_4c[10] = '\0';
  local_4c[0xb] = '\0';
  pcVar1 = local_4c;
  this = &local_30;
  l_00._M_array._4_4_ = in_stack_fffffffffffffed4;
  l_00._M_array._0_4_ = in_stack_fffffffffffffed0;
  l_00._M_len = in_stack_fffffffffffffed8;
  local_40 = pcVar1;
  roaring::Roaring::bitmapOfList(l_00);
  roaring::Roaring::printf(this,pcVar1);
  printf("\n");
  pcVar1 = (char *)0x3;
  roaring::Roaring::bitmapOf((size_t)&local_88,3,1,2,4);
  roaring::Roaring::printf(&local_88,pcVar1);
  printf("\n");
  roaring::Roaring::operator==
            (this,(Roaring *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  _assert_true(CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),(char *)this,
               in_stack_fffffffffffffebc);
  local_cc = 1;
  local_c8 = 2;
  local_c4 = 4;
  local_c0 = &local_cc;
  local_b8 = 3;
  l._M_array._4_4_ = in_stack_fffffffffffffecc;
  l._M_array._0_4_ = in_stack_fffffffffffffec8;
  l._M_len._0_4_ = in_stack_fffffffffffffed0;
  l._M_len._4_4_ = in_stack_fffffffffffffed4;
  roaring::Roaring::Roaring(this,l);
  roaring::Roaring::operator==
            (this,(Roaring *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  _assert_true(CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),(char *)this,
               in_stack_fffffffffffffebc);
  local_114 = 7;
  uVar5 = 8;
  uVar6 = 9;
  puVar7 = &local_114;
  sVar8 = 3;
  l_01._M_array._4_4_ = in_stack_fffffffffffffed4;
  l_01._M_array._0_4_ = in_stack_fffffffffffffed0;
  l_01._M_len = in_stack_fffffffffffffed8;
  roaring::Roaring::bitmapOfList(l_01);
  uVar2 = 1;
  uVar3 = 2;
  uVar4 = 4;
  l_02._M_len = sVar8;
  l_02._M_array = puVar7;
  roaring::Roaring::operator=((Roaring *)CONCAT44(uVar6,uVar5),l_02);
  roaring::Roaring::operator==
            (this,(Roaring *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  _assert_true(CONCAT44(uVar4,uVar3),(char *)CONCAT44(uVar2,in_stack_fffffffffffffec8),(char *)this,
               in_stack_fffffffffffffebc);
  roaring::Roaring::~Roaring(this);
  roaring::Roaring::~Roaring(this);
  roaring::Roaring::~Roaring(this);
  roaring::Roaring::~Roaring(this);
  return;
}

Assistant:

DEFINE_TEST(test_bitmap_of_32) {
    Roaring r1 = Roaring::bitmapOfList({1, 2, 4});
    r1.printf();
    printf("\n");
    Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
    r2.printf();
    printf("\n");
    assert_true(r1 == r2);

    Roaring r1d = {1, 2, 4};
    assert_true(r1 == r1d);

    Roaring r3a = Roaring::bitmapOfList({7, 8, 9});
    r3a = {1, 2, 4};  // overwrite with assignment operator
    assert_true(r1 == r3a);
}